

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

bool icu_63::number::impl::GeneratorHelpers::integerWidth
               (MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  bool bVar1;
  UErrorCode *pUVar2;
  IntegerWidth IVar3;
  anon_union_8_2_136a0349_for_fUnion local_28;
  undefined1 local_20;
  
  if (((macros->integerWidth).fHasError == false) &&
     (((macros->integerWidth).fHasError != false ||
      ((macros->integerWidth).fUnion.minMaxInt.fMinInt != -1)))) {
    IVar3 = IntegerWidth::zeroFillTo(1);
    local_28 = IVar3.fUnion;
    local_20 = IVar3.fHasError;
    bVar1 = IntegerWidth::operator==(&macros->integerWidth,(IntegerWidth *)&local_28.minMaxInt);
    if (!bVar1) {
      pUVar2 = (UErrorCode *)0xffffffff;
      UnicodeString::doAppend(sb,L"integer-width/",0,-1);
      blueprint_helpers::generateIntegerWidthOption
                ((int)(macros->integerWidth).fUnion.minMaxInt.fMinInt,
                 (int)(macros->integerWidth).fUnion.minMaxInt.fMaxInt,sb,pUVar2);
      return true;
    }
  }
  return false;
}

Assistant:

bool GeneratorHelpers::integerWidth(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    if (macros.integerWidth.fHasError || macros.integerWidth.isBogus() ||
        macros.integerWidth == IntegerWidth::standard()) {
        // Error or Default
        return false;
    }
    sb.append(u"integer-width/", -1);
    blueprint_helpers::generateIntegerWidthOption(
            macros.integerWidth.fUnion.minMaxInt.fMinInt,
            macros.integerWidth.fUnion.minMaxInt.fMaxInt,
            sb,
            status);
    return true;
}